

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::
list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::release
          (list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
           *this)

{
  node *pnVar1;
  node *pnVar2;
  
  pnVar2 = this->head_;
  while (pnVar2 != (node *)0x0) {
    pnVar1 = pnVar2->prev;
    operator_delete(pnVar2,0x2808);
    this->head_ = pnVar1;
    pnVar2 = pnVar1;
  }
  return;
}

Assistant:

void release() {
    // Suppose node was contained by an std::unique_ptr, then it may happen
    // that we hit a recursion limit depending on how many nodes are destructed.
    while (head_ != nullptr) {
      node* n = head_->prev;
      delete head_;
      head_ = n;
    }
  }